

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O0

void Ptex::v2_2::anon_unknown_3::ApplyN<float>
               (PtexSeparableKernel *k,float *result,void *data,int nChan,int nTxChan)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  void *dst;
  int iVar5;
  undefined8 uStack_90;
  float afStack_88 [4];
  void *local_78;
  VecAccumN<float> local_6b;
  VecAccumN<float> local_6a;
  VecMultN<float> local_69;
  float *local_68;
  float *pRowEnd;
  float *kup;
  float *pEnd;
  float *p;
  float *kvp;
  int local_38;
  int rowskip;
  int datalen;
  int rowlen;
  float *rowResult;
  int nTxChan_local;
  int nChan_local;
  void *data_local;
  float *result_local;
  PtexSeparableKernel *k_local;
  
  lVar2 = -((long)nChan * 4 + 0xfU & 0xfffffffffffffff0);
  _datalen = (float *)((long)afStack_88 + lVar2);
  rowResult._0_4_ = nTxChan;
  rowResult._4_4_ = nChan;
  _nTxChan_local = data;
  data_local = result;
  result_local = (float *)k;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0xb08ca4;
  iVar5 = Res::u(&k->res);
  pfVar3 = result_local;
  rowskip = iVar5 * (int)rowResult;
  local_38 = (int)result_local[3] * (int)rowResult;
  kvp._4_4_ = rowskip - local_38;
  p = *(float **)(result_local + 8);
  local_78 = _nTxChan_local;
  afStack_88[3] = result_local[2];
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0xb08ce9;
  iVar5 = Res::u((Res *)pfVar3);
  pEnd = (float *)((long)local_78 +
                  (long)(((int)afStack_88[3] * iVar5 + (int)result_local[1]) * (int)rowResult) * 4);
  kup = pEnd + (int)result_local[4] * rowskip;
  for (; iVar5 = rowResult._4_4_, pfVar4 = _datalen, pfVar3 = pEnd, pEnd != kup;
      pEnd = pEnd + kvp._4_4_) {
    local_68 = pEnd + local_38;
    pRowEnd = *(float **)(result_local + 6) + 1;
    fVar1 = **(float **)(result_local + 6);
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0xb08d7f;
    PtexUtils::VecMultN<float>::operator()(&local_69,pfVar4,pfVar3,iVar5,fVar1);
    for (pEnd = pEnd + (int)rowResult; dst = data_local, iVar5 = rowResult._4_4_, pfVar4 = _datalen,
        pfVar3 = pEnd, pEnd != local_68; pEnd = pEnd + (int)rowResult) {
      fVar1 = *pRowEnd;
      pRowEnd = pRowEnd + 1;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0xb08dc5;
      PtexUtils::VecAccumN<float>::operator()(&local_6a,pfVar4,pfVar3,iVar5,fVar1);
    }
    fVar1 = *p;
    p = p + 1;
    *(undefined8 *)((long)&uStack_90 + lVar2) = 0xb08e03;
    PtexUtils::VecAccumN<float>::operator()(&local_6b,(float *)dst,pfVar4,iVar5,fVar1);
  }
  return;
}

Assistant:

void ApplyN(PtexSeparableKernel& k, float* result, void* data, int nChan, int nTxChan)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nTxChan;
        int datalen = k.uw * nTxChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nTxChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMultN<T>()(rowResult, p, nChan, *kup++);
            p += nTxChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccumN<T>()(rowResult, p, nChan, *kup++);
                p += nTxChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccumN<float>()(result, rowResult, nChan, *kvp++);
            p += rowskip;
        }
    }